

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::Prog::Optimize(Prog *this)

{
  Inst *pIVar1;
  int iVar2;
  uint uVar3;
  Inst *pIVar4;
  Inst *pIVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Inst *pIVar10;
  uint *puVar11;
  uint i;
  Workq q;
  SparseSet local_48;
  
  SparseSet::SparseSet(&local_48,this->size_);
  local_48.size_ = 0;
  iVar2 = this->start_;
  if (iVar2 != 0) {
    bVar6 = SparseSet::contains(&local_48,iVar2);
    if (!bVar6) {
      SparseSet::insert_new(&local_48,iVar2);
    }
    puVar11 = (uint *)local_48.dense_;
    if (local_48.size_ != 0) {
      do {
        uVar3 = *puVar11;
        pIVar4 = this->inst_;
        uVar7 = pIVar4[(int)uVar3].out_opcode_;
        uVar8 = uVar7;
        do {
          uVar9 = uVar8;
          if (uVar9 < 0x10) {
            pIVar4[(int)uVar3].out_opcode_ = uVar7 & 0xf;
            goto LAB_00130b3f;
          }
          i = uVar9 >> 4;
          uVar8 = pIVar4[i].out_opcode_;
        } while ((pIVar4[i].out_opcode_ & 7) == 6);
        pIVar4[(int)uVar3].out_opcode_ = uVar7 & 0xf | uVar9 & 0xfffffff0;
        bVar6 = SparseSet::contains(&local_48,i);
        if (!bVar6) {
          SparseSet::insert_new(&local_48,i);
        }
LAB_00130b3f:
        if ((pIVar4[(int)uVar3].out_opcode_ & 7) == 0) {
          uVar7 = pIVar4[(int)uVar3].field_1.cap_;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            do {
              uVar8 = this->inst_[(int)uVar7].out_opcode_;
              if ((uVar8 & 7) != 6) {
                pIVar4[(int)uVar3].field_1.cap_ = uVar7;
                bVar6 = SparseSet::contains(&local_48,uVar7);
                if (!bVar6) {
                  SparseSet::insert_new(&local_48,uVar7);
                }
                goto LAB_00130b76;
              }
              uVar7 = uVar8 >> 4;
            } while (0xf < uVar8);
          }
          pIVar4[(int)uVar3].field_1.out1_ = uVar7;
        }
LAB_00130b76:
        puVar11 = puVar11 + 1;
      } while (puVar11 != (uint *)(local_48.dense_ + local_48.size_));
    }
    iVar2 = this->start_;
    local_48.size_ = 0;
    if (iVar2 != 0) {
      bVar6 = SparseSet::contains(&local_48,iVar2);
      if (!bVar6) {
        SparseSet::insert_new(&local_48,iVar2);
      }
      puVar11 = (uint *)local_48.dense_;
      if (local_48.size_ != 0) {
        do {
          uVar3 = *puVar11;
          pIVar4 = this->inst_;
          if (0xf < pIVar4[(int)uVar3].out_opcode_) {
            uVar7 = pIVar4[(int)uVar3].out_opcode_ >> 4;
            bVar6 = SparseSet::contains(&local_48,uVar7);
            if (!bVar6) {
              SparseSet::insert_new(&local_48,uVar7);
            }
          }
          if ((((pIVar4[(int)uVar3].out_opcode_ & 7) == 0) &&
              (iVar2 = pIVar4[(int)uVar3].field_1.cap_, iVar2 != 0)) &&
             (bVar6 = SparseSet::contains(&local_48,iVar2), !bVar6)) {
            SparseSet::insert_new(&local_48,iVar2);
          }
          uVar7 = pIVar4[(int)uVar3].out_opcode_;
          if ((uVar7 & 7) == 0) {
            uVar9 = uVar7 >> 4;
            pIVar5 = this->inst_;
            pIVar1 = pIVar5 + pIVar4[(int)uVar3].field_1.cap_;
            uVar8 = pIVar5[uVar9].out_opcode_;
            if ((((uVar8 & 7) == 2) && (uVar8 >> 4 == uVar3)) &&
               ((pIVar5[uVar9].field_1.field_3.lo_ == '\0' &&
                (pIVar10 = pIVar1, pIVar5[uVar9].field_1.field_3.hi_ == 0xff)))) {
              while( true ) {
                uVar9 = pIVar10->out_opcode_ & 7;
                if ((0x48U >> uVar9 & 1) == 0) break;
                pIVar10 = pIVar5 + (pIVar10->out_opcode_ >> 4);
              }
              if ((0x97U >> uVar9 & 1) != 0) goto LAB_00130cc0;
            }
            else {
LAB_00130cc0:
              for (; (0x48U >> (uVar8 & 7) & 1) != 0; uVar8 = pIVar5[uVar8 >> 4].out_opcode_) {
              }
              if ((((0x97U >> (uVar8 & 7) & 1) != 0) || ((pIVar1->out_opcode_ & 7) != 2)) ||
                 ((pIVar1->out_opcode_ >> 4 != uVar3 ||
                  (((pIVar1->field_1).field_3.lo_ != '\0' || ((pIVar1->field_1).field_3.hi_ != 0xff)
                   ))))) goto LAB_00130cd5;
            }
            pIVar4[(int)uVar3].out_opcode_ = uVar7 | 1;
          }
LAB_00130cd5:
          puVar11 = puVar11 + 1;
        } while (puVar11 != (uint *)(local_48.dense_ + local_48.size_));
      }
    }
  }
  SparseSet::~SparseSet(&local_48);
  return;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}